

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>
     ::transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
               (allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *alloc,slot_type *new_slot,
               slot_type *old_slot)

{
  undefined8 in_RDX;
  slot_type *in_RSI;
  slot_type *in_RDI;
  
  transfer_impl<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
            ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)&old_slot->value,in_RDI,
             in_RSI,(int)((ulong)in_RDX >> 0x20));
  return;
}

Assistant:

static void transfer(Alloc* alloc, slot_type* new_slot, slot_type* old_slot)
			{
				transfer_impl(alloc, new_slot, old_slot, 0);
			}